

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertEqualStringLen
               (char *expected,char *actual,UNITY_UINT32 length,char *msg,UNITY_UINT lineNumber)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (actual == (char *)0x0 || expected == (char *)0x0) {
      if (expected == actual) {
        return;
      }
    }
    else {
      uVar3 = 0;
      do {
        if (length == uVar3) {
          return;
        }
        pcVar1 = expected + uVar3;
        pcVar2 = actual + uVar3;
        if (*pcVar1 == '\0' && *pcVar2 == '\0') {
          return;
        }
        uVar3 = uVar3 + 1;
      } while (*pcVar1 == *pcVar2);
    }
    Unity.CurrentTestFailed = 1;
    UnityTestResultsFailBegin(lineNumber);
    UnityPrintExpectedAndActualStringsLen(expected,actual,length);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualStringLen(const char* expected,
                               const char* actual,
                               const UNITY_UINT32 length,
                               const char* msg,
                               const UNITY_LINE_TYPE lineNumber)
{
    UNITY_UINT32 i;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; (i < length) && (expected[i] || actual[i]); i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrintExpectedAndActualStringsLen(expected, actual, length);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}